

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

void __thiscall
duckdb::WindowPartitionGlobalSinkState::OnSortedPartition
          (WindowPartitionGlobalSinkState *this,idx_t group_idx)

{
  WindowGlobalSinkState *gstate;
  WindowHashGroup *this_00;
  __uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_> *this_01;
  
  gstate = this->gsink;
  this_00 = (WindowHashGroup *)operator_new(0x188);
  WindowHashGroup::WindowHashGroup(this_00,gstate,group_idx);
  this_01 = (__uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_>
             *)vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_true>
               ::operator[](&this->window_hash_groups,group_idx);
  ::std::__uniq_ptr_impl<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>_>::
  reset(this_01,this_00);
  return;
}

Assistant:

void OnSortedPartition(const idx_t group_idx) override {
		PartitionGlobalSinkState::OnSortedPartition(group_idx);
		window_hash_groups[group_idx] = make_uniq<WindowHashGroup>(gsink, group_idx);
	}